

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

void __thiscall google::protobuf::MessageLite::DeleteInstance(MessageLite *this)

{
  int iVar1;
  uint32_t uVar2;
  undefined4 extraout_var;
  void *ptr;
  size_t size;
  MessageLite *this_local;
  
  iVar1 = (*this->_vptr_MessageLite[4])();
  uVar2 = internal::ClassData::allocation_size((ClassData *)CONCAT44(extraout_var,iVar1));
  DestroyInstance(this);
  internal::SizedDelete(this,(ulong)uVar2);
  return;
}

Assistant:

void MessageLite::DeleteInstance() {
  // Cache the size and pointer because we can't access them after the
  // destruction.
  const size_t size = GetClassData()->allocation_size();
  void* const ptr = this;
  DestroyInstance();
  internal::SizedDelete(ptr, size);
}